

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)32,(moira::Mode)7,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  uVar2 = readI<(moira::Size)1>(this);
  bVar1 = readOp<(moira::Mode)7,(moira::Size)1,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    (this->reg).sr.z = (local_20 >> (uVar2 & 7) & 1) == 0;
    local_20 = local_20 | 1 << ((byte)uVar2 & 7);
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_1c,local_20);
  }
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}